

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall tchecker::syncprod::system_t::compute_labels(system_t *this)

{
  undefined8 this_00;
  bool bVar1;
  label_id_t lVar2;
  integer_iterator_t<unsigned_int> *piVar3;
  size_t sVar4;
  reference pvVar5;
  element_type *peVar6;
  attributes_t *paVar7;
  reference name;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar8;
  string *l_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_138;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  local_118;
  undefined1 local_108 [24];
  attributes_t *attr_1;
  integer_iterator_t<unsigned_int> local_e8;
  loc_id_t loc_id_1;
  integer_iterator_t<unsigned_int> __end2_2;
  integer_iterator_t<unsigned_int> __begin2_2;
  locations_identifiers_range_t *__range2_2;
  pointer local_d0;
  label_id_t *labels_count;
  string *l;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_a0;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  local_80;
  undefined1 local_70 [24];
  attributes_t *attr;
  integer_iterator_t<unsigned_int> local_50;
  loc_id_t loc_id;
  integer_iterator_t<unsigned_int> __end2;
  integer_iterator_t<unsigned_int> local_3c;
  range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
  *prStack_38;
  integer_iterator_t<unsigned_int> __begin2;
  locations_identifiers_range_t *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  locations_identifiers_range_t locations_identifiers;
  system_t *this_local;
  
  labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)tchecker::system::locs_t::locations_identifiers
                          (&(this->super_system_t).super_locs_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  prStack_38 = (range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
                *)&labels.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
  piVar3 = range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
           ::begin(prStack_38);
  local_3c._current = piVar3->_current;
  piVar3 = range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
           ::end(prStack_38);
  local_50._current = piVar3->_current;
  while( true ) {
    bVar1 = integer_iterator_t<unsigned_int>::operator!=(&local_3c,&local_50);
    if (!bVar1) break;
    attr._4_4_ = integer_iterator_t<unsigned_int>::operator*(&local_3c);
    tchecker::system::locs_t::location((locs_t *)local_70,(int)this + 0x230);
    peVar6 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_70);
    paVar7 = tchecker::system::loc_t::attributes(peVar6);
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)local_70);
    local_70._16_8_ = paVar7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"labels",(allocator<char> *)((long)&__range2_1 + 7));
    rVar8 = tchecker::system::attributes_t::range(paVar7,&local_a0);
    local_80 = rVar8;
    labels_from_attrs(&local_80,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
    integer_iterator_t<unsigned_int>::operator++(&local_3c);
  }
  __end2_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
  l = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&l);
    if (!bVar1) break;
    labels_count = (label_id_t *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_1);
    bVar1 = labels_t::is_label(&this->super_labels_t,(string *)labels_count);
    if (!bVar1) {
      labels_t::add_label(&this->super_labels_t,(string *)labels_count);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_1);
  }
  sVar4 = labels_t::labels_count(&this->super_labels_t);
  __range2_2._4_4_ = (undefined4)sVar4;
  local_d0 = (pointer)((long)&__range2_2 + 4);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->_labels);
  sVar4 = tchecker::system::locs_t::locations_count(&(this->super_system_t).super_locs_t);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->_labels,sVar4);
  ___end2_2 = (range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
               *)&labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  piVar3 = range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
           ::begin(___end2_2);
  loc_id_1 = piVar3->_current;
  piVar3 = range_t<tchecker::integer_iterator_t<unsigned_int>,_tchecker::integer_iterator_t<unsigned_int>_>
           ::end(___end2_2);
  local_e8._current = piVar3->_current;
  while( true ) {
    bVar1 = integer_iterator_t<unsigned_int>::operator!=
                      ((integer_iterator_t<unsigned_int> *)&loc_id_1,&local_e8);
    if (!bVar1) break;
    attr_1._4_4_ = integer_iterator_t<unsigned_int>::operator*
                             ((integer_iterator_t<unsigned_int> *)&loc_id_1);
    pvVar5 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->_labels,(ulong)attr_1._4_4_);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar5,(ulong)*(uint *)&(local_d0->
                                       super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start,false);
    pvVar5 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->_labels,(ulong)attr_1._4_4_);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(pvVar5);
    tchecker::system::locs_t::location((locs_t *)local_108,(int)this + 0x230);
    peVar6 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_108);
    paVar7 = tchecker::system::loc_t::attributes(peVar6);
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)local_108);
    local_108._16_8_ = paVar7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
    this_00 = local_108._16_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"labels",(allocator<char> *)((long)&__range3 + 7));
    rVar8 = tchecker::system::attributes_t::range((attributes_t *)this_00,&local_138);
    local_118 = rVar8;
    labels_from_attrs(&local_118,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    l_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&l_1);
      if (!bVar1) break;
      name = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
      pvVar5 = std::
               vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->_labels,(ulong)attr_1._4_4_);
      lVar2 = labels_t::label_id(&this->super_labels_t,name);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (pvVar5,(ulong)lVar2,true);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    integer_iterator_t<unsigned_int>::operator++((integer_iterator_t<unsigned_int> *)&loc_id_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  return;
}

Assistant:

void system_t::compute_labels()
{
  tchecker::system::locs_t::locations_identifiers_range_t const locations_identifiers = this->locations_identifiers();

  // Compute labels index
  std::vector<std::string> labels;
  for (tchecker::loc_id_t const loc_id : locations_identifiers) {
    auto const & attr = tchecker::syncprod::system_t::location(loc_id)->attributes();
    labels_from_attrs(attr.range("labels"), labels);
  }

  for (std::string const & l : labels) {
    if (!tchecker::syncprod::labels_t::is_label(l))
      tchecker::syncprod::labels_t::add_label(l);
  }

  // Set location labels
  tchecker::label_id_t const & labels_count = this->labels_count();

  _labels.clear();
  _labels.resize(this->locations_count());

  for (tchecker::loc_id_t const loc_id : locations_identifiers) {
    _labels[loc_id].resize(labels_count);
    _labels[loc_id].reset();
    auto const & attr = tchecker::syncprod::system_t::location(loc_id)->attributes();
    labels.clear();
    labels_from_attrs(attr.range("labels"), labels);
    for (std::string const & l : labels)
      _labels[loc_id].set(this->label_id(l));
  }
}